

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O3

void __thiscall
directed_flag_complex_t::
do_for_each_cell<count_cells(filtered_directed_graph_t&,flagser_parameters_const&)::cell_counter_t>
          (directed_flag_complex_t *this,cell_counter_t *f,int min_dimension,int max_dimension,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *possible_next_vertices,
          vertex_index_t *prefix,unsigned_short prefix_size)

{
  ushort uVar1;
  ushort *puVar2;
  long lVar3;
  byte bVar4;
  pointer puVar5;
  filtered_directed_graph_t *pfVar6;
  undefined4 in_register_0000000c;
  ulong uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  ushort *puVar10;
  unsigned_short v;
  vector<unsigned_short,_std::allocator<unsigned_short>_> new_possible_vertices;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range4;
  ushort local_92;
  directed_flag_complex_t *local_90;
  void *local_88;
  iterator iStack_80;
  unsigned_short *local_78;
  cell_counter_t *local_70;
  uint local_68;
  int local_64;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_60;
  undefined8 local_58;
  ulong local_50;
  vertex_index_t *local_48;
  ushort *local_40;
  ushort *local_38;
  
  local_58 = CONCAT44(in_register_0000000c,max_dimension);
  uVar7 = (ulong)prefix_size;
  local_90 = this;
  local_70 = f;
  local_64 = min_dimension;
  local_60 = possible_next_vertices;
  if (min_dimension < (int)(uint)prefix_size) {
    f->ec = f->ec + (-(ulong)((prefix_size & 1) == 0) | 1);
    puVar5 = (f->cell_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(f->cell_counts).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar5 >> 3) < uVar7) {
      local_88 = (void *)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&f->cell_counts,uVar7,(value_type_conflict3 *)&local_88);
      puVar5 = (f->cell_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    puVar5[uVar7 - 1] = puVar5[uVar7 - 1] + 1;
  }
  if ((int)local_58 + 1U != (uint)prefix_size) {
    local_38 = (local_60->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
               _M_impl.super__Vector_impl_data._M_start;
    local_40 = (local_60->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    if (local_38 != local_40) {
      local_68 = prefix_size + 1 & 0xffff;
      local_50 = uVar7;
      local_48 = prefix;
      do {
        uVar1 = *local_38;
        prefix[uVar7] = uVar1;
        local_88 = (void *)0x0;
        iStack_80._M_current = (unsigned_short *)0x0;
        local_78 = (unsigned_short *)0x0;
        if (prefix_size == 0) {
          pfVar6 = local_90->graph;
          uVar7 = (pfVar6->super_directed_graph_t).incidence_row_length;
          if (uVar7 != 0) {
            uVar8 = 0;
            do {
              uVar9 = (pfVar6->super_directed_graph_t).incidence_outgoing.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7 * uVar1 + uVar8];
              if (uVar9 != 0) {
                do {
                  lVar3 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                    }
                  }
                  local_92 = (ushort)lVar3 | (ushort)(uVar8 << 6);
                  if (iStack_80._M_current == local_78) {
                    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                    _M_realloc_insert<unsigned_short>
                              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_88,
                               iStack_80,&local_92);
                  }
                  else {
                    *iStack_80._M_current = local_92;
                    iStack_80._M_current = iStack_80._M_current + 1;
                  }
                  bVar4 = (byte)lVar3 & 0x3f;
                  uVar9 = uVar9 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                } while (uVar9 != 0);
                pfVar6 = local_90->graph;
              }
              uVar8 = uVar8 + 1;
              uVar7 = (pfVar6->super_directed_graph_t).incidence_row_length;
            } while (uVar8 < uVar7);
          }
        }
        else {
          puVar2 = (local_60->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar10 = (local_60->
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                         _M_impl.super__Vector_impl_data._M_start; puVar10 != puVar2;
              puVar10 = puVar10 + 1) {
            local_92 = *puVar10;
            if ((uVar1 != local_92) &&
               (((local_90->graph->super_directed_graph_t).incidence_outgoing.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(local_90->graph->super_directed_graph_t).incidence_row_length * (ulong)uVar1 +
                  (ulong)(local_92 >> 6)] >> ((ulong)local_92 & 0x3f) & 1) != 0)) {
              if (iStack_80._M_current == local_78) {
                std::vector<unsigned_short,std::allocator<unsigned_short>>::
                _M_realloc_insert<unsigned_short_const&>
                          ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_88,
                           iStack_80,&local_92);
              }
              else {
                *iStack_80._M_current = local_92;
                iStack_80._M_current = iStack_80._M_current + 1;
              }
            }
          }
        }
        prefix = local_48;
        do_for_each_cell<count_cells(filtered_directed_graph_t&,flagser_parameters_const&)::cell_counter_t>
                  (local_90,local_70,local_64,(int)local_58,
                   (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_88,local_48,
                   (unsigned_short)local_68);
        puVar10 = local_38;
        uVar7 = local_50;
        if (local_88 != (void *)0x0) {
          operator_delete(local_88,(long)local_78 - (long)local_88);
        }
        local_38 = puVar10 + 1;
      } while (local_38 != local_40);
    }
  }
  return;
}

Assistant:

void do_for_each_cell(Func& f, int min_dimension, int max_dimension,
	                      const std::vector<vertex_index_t>& possible_next_vertices, vertex_index_t* prefix,
	                      unsigned short prefix_size = 0) {
		// As soon as we have the correct dimension, execute f
		if (prefix_size >= min_dimension + 1) { f(prefix, prefix_size); }

		// If this is the last dimension we are interested in, exit this branch
		if (prefix_size == max_dimension + 1) return;

		for (auto vertex : possible_next_vertices) {
			// We can write the cell given by taking the current vertex as the maximal element
			prefix[prefix_size] = vertex;

			// And compute the next elements
			std::vector<vertex_index_t> new_possible_vertices;
			if (prefix_size > 0) {
				for (auto v : possible_next_vertices) {
					if (vertex != v && graph.is_connected_by_an_edge(vertex, v)) new_possible_vertices.push_back(v);
				}
			} else {
				// Get outgoing vertices of v in chunks of 64
				for (size_t offset = 0; offset < graph.incidence_row_length; offset++) {
					size_t bits = graph.get_outgoing_chunk(vertex, offset);

					size_t vertex_offset = offset << 6;
					while (bits > 0) {
						// Get the least significant non-zero bit
						auto b = __builtin_ctzl(bits);

						// Unset this bit
						bits &= ~(ONE_ << b);

						new_possible_vertices.push_back(vertex_index_t(vertex_offset + b));
					}
				}
			}

			do_for_each_cell(f, min_dimension, max_dimension, new_possible_vertices, prefix, prefix_size + 1);
		}
	}